

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessor_case.cc
# Opt level: O3

string_view google::protobuf::compiler::rust::ViewReceiver(AccessorCase accessor_case)

{
  string_view sVar1;
  
  if (accessor_case < (VIEW|MUT)) {
    sVar1._M_str = &DAT_0046ac80 + *(int *)(&DAT_0046ac80 + (ulong)accessor_case * 4);
    sVar1._M_len = *(size_t *)((long)&DAT_0046ac8d + (ulong)accessor_case * 8 + 3);
    return sVar1;
  }
  return (string_view)(ZEXT816(0x33c549) << 0x40);
}

Assistant:

absl::string_view ViewReceiver(AccessorCase accessor_case) {
  switch (accessor_case) {
    case AccessorCase::VIEW:
      return "self";
    case AccessorCase::OWNED:
    case AccessorCase::MUT:
      return "&self";
  }
  return "";
}